

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O3

CLIENT * local_rpcb(char *tag)

{
  int32_t *piVar1;
  ushort uVar2;
  int iVar3;
  u_int sendsz;
  size_t sVar4;
  CLIENT *pCVar5;
  char *pcVar6;
  void *handlep;
  netconfig *nconf;
  uint16_t uVar7;
  char *pcVar8;
  mem_format_t p_Var9;
  bool bVar10;
  sockaddr_un sun;
  netbuf nbuf;
  netconfig *local_c8;
  undefined2 local_b8;
  char acStack_b6 [118];
  netbuf local_40;
  
  acStack_b6[0x5e] = '\0';
  acStack_b6[0x5f] = '\0';
  acStack_b6[0x60] = '\0';
  acStack_b6[0x61] = '\0';
  acStack_b6[0x62] = '\0';
  acStack_b6[99] = '\0';
  acStack_b6[100] = '\0';
  acStack_b6[0x65] = '\0';
  acStack_b6[0x66] = '\0';
  acStack_b6[0x67] = '\0';
  acStack_b6[0x68] = '\0';
  acStack_b6[0x69] = '\0';
  acStack_b6[0x6a] = '\0';
  acStack_b6[0x6b] = '\0';
  acStack_b6[0x4e] = '\0';
  acStack_b6[0x4f] = '\0';
  acStack_b6[0x50] = '\0';
  acStack_b6[0x51] = '\0';
  acStack_b6[0x52] = '\0';
  acStack_b6[0x53] = '\0';
  acStack_b6[0x54] = '\0';
  acStack_b6[0x55] = '\0';
  acStack_b6[0x56] = '\0';
  acStack_b6[0x57] = '\0';
  acStack_b6[0x58] = '\0';
  acStack_b6[0x59] = '\0';
  acStack_b6[0x5a] = '\0';
  acStack_b6[0x5b] = '\0';
  acStack_b6[0x5c] = '\0';
  acStack_b6[0x5d] = '\0';
  acStack_b6[0x3e] = '\0';
  acStack_b6[0x3f] = '\0';
  acStack_b6[0x40] = '\0';
  acStack_b6[0x41] = '\0';
  acStack_b6[0x42] = '\0';
  acStack_b6[0x43] = '\0';
  acStack_b6[0x44] = '\0';
  acStack_b6[0x45] = '\0';
  acStack_b6[0x46] = '\0';
  acStack_b6[0x47] = '\0';
  acStack_b6[0x48] = '\0';
  acStack_b6[0x49] = '\0';
  acStack_b6[0x4a] = '\0';
  acStack_b6[0x4b] = '\0';
  acStack_b6[0x4c] = '\0';
  acStack_b6[0x4d] = '\0';
  acStack_b6[0x2e] = '\0';
  acStack_b6[0x2f] = '\0';
  acStack_b6[0x30] = '\0';
  acStack_b6[0x31] = '\0';
  acStack_b6[0x32] = '\0';
  acStack_b6[0x33] = '\0';
  acStack_b6[0x34] = '\0';
  acStack_b6[0x35] = '\0';
  acStack_b6[0x36] = '\0';
  acStack_b6[0x37] = '\0';
  acStack_b6[0x38] = '\0';
  acStack_b6[0x39] = '\0';
  acStack_b6[0x3a] = '\0';
  acStack_b6[0x3b] = '\0';
  acStack_b6[0x3c] = '\0';
  acStack_b6[0x3d] = '\0';
  acStack_b6[0x1e] = '\0';
  acStack_b6[0x1f] = '\0';
  acStack_b6[0x20] = '\0';
  acStack_b6[0x21] = '\0';
  acStack_b6[0x22] = '\0';
  acStack_b6[0x23] = '\0';
  acStack_b6[0x24] = '\0';
  acStack_b6[0x25] = '\0';
  acStack_b6[0x26] = '\0';
  acStack_b6[0x27] = '\0';
  acStack_b6[0x28] = '\0';
  acStack_b6[0x29] = '\0';
  acStack_b6[0x2a] = '\0';
  acStack_b6[0x2b] = '\0';
  acStack_b6[0x2c] = '\0';
  acStack_b6[0x2d] = '\0';
  acStack_b6[0xe] = '\0';
  acStack_b6[0xf] = '\0';
  acStack_b6[0x10] = '\0';
  acStack_b6[0x11] = '\0';
  acStack_b6[0x12] = '\0';
  acStack_b6[0x13] = '\0';
  acStack_b6[0x14] = '\0';
  acStack_b6[0x15] = '\0';
  acStack_b6[0x16] = '\0';
  acStack_b6[0x17] = '\0';
  acStack_b6[0x18] = '\0';
  acStack_b6[0x19] = '\0';
  acStack_b6[0x1a] = '\0';
  acStack_b6[0x1b] = '\0';
  acStack_b6[0x1c] = '\0';
  acStack_b6[0x1d] = '\0';
  local_b8 = 0;
  acStack_b6[0] = '\0';
  acStack_b6[1] = '\0';
  acStack_b6[2] = '\0';
  acStack_b6[3] = '\0';
  acStack_b6[4] = '\0';
  acStack_b6[5] = '\0';
  acStack_b6[6] = '\0';
  acStack_b6[7] = '\0';
  acStack_b6[8] = '\0';
  acStack_b6[9] = '\0';
  acStack_b6[10] = '\0';
  acStack_b6[0xb] = '\0';
  acStack_b6[0xc] = '\0';
  acStack_b6[0xd] = '\0';
  iVar3 = socket(1,1,0);
  if (iVar3 < 0) {
    pCVar5 = clnt_raw_ncreate(100000,3);
  }
  else {
    local_b8 = 1;
    builtin_strncpy(acStack_b6,"/var/run/rpcbind.sock",0x16);
    sVar4 = strlen(acStack_b6);
    local_40.len = (int)sVar4 + 2;
    local_40.maxlen = 0x6e;
    local_40.buf = &local_b8;
    sendsz = __rpc_get_t_size(1,0,0);
    pCVar5 = clnt_vc_ncreatef(iVar3,&local_40,100000,3,sendsz,sendsz,0x10000010);
    if ((pCVar5->cl_error).re_status == RPC_SUCCESS) {
      return pCVar5;
    }
    pcVar6 = rpc_sperror(&pCVar5->cl_error,tag);
    if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x80) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s",pcVar6);
    }
    (*__ntirpc_pkg_params.free_size_)(pcVar6,0x100);
    close(iVar3);
  }
  pthread_mutex_lock((pthread_mutex_t *)&loopnconf_lock);
  if (local_rpcb::loopnconf == (netconfig *)0x0) {
    handlep = setnetconfig();
    if (handlep == (void *)0x0) {
      syslog(3,"rpc: failed to open /etc/netconfig");
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var9 = __ntirpc_pkg_params.warnx_;
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar6 = clnt_sperrno(RPC_UNKNOWNPROTO);
        pcVar8 = "%s(%s): failed to open /etc/netconfig %s";
LAB_00114fca:
        (*p_Var9)(pcVar8,"local_rpcb",tag,pcVar6);
      }
    }
    else {
      local_c8 = (netconfig *)0x0;
      while (nconf = getnetconfig(handlep), nconf != (netconfig *)0x0) {
        pcVar6 = nconf->nc_protofmly;
        iVar3 = strcmp(pcVar6,"inet6");
        if ((((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"inet"), iVar3 == 0)) &&
            ((nconf->nc_semantics & 0xfffffffffffffffe) == 2)) &&
           (iVar3 = __rpc_nconf2fd(nconf), -1 < iVar3)) {
          close(iVar3);
          iVar3 = strcmp(nconf->nc_protofmly,"inet");
          local_rpcb::hostname = "::1";
          local_c8 = nconf;
          if (iVar3 == 0) {
            local_rpcb::hostname = "127.0.0.1";
          }
        }
      }
      if (local_c8 != (netconfig *)0x0) {
        local_rpcb::loopnconf = getnetconfigent(local_c8->nc_netid);
        endnetconfig(handlep);
        goto LAB_00114daa;
      }
      endnetconfig(handlep);
      pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
      p_Var9 = __ntirpc_pkg_params.warnx_;
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        pcVar6 = clnt_sperrno(RPC_UNKNOWNPROTO);
        pcVar8 = "%s(%s): failed to find /etc/netconfig %s";
        goto LAB_00114fca;
      }
    }
    (pCVar5->cl_error).re_status = RPC_UNKNOWNPROTO;
  }
  else {
LAB_00114daa:
    pthread_mutex_unlock((pthread_mutex_t *)&loopnconf_lock);
    uVar7 = pCVar5->cl_flags;
    do {
      LOCK();
      uVar2 = pCVar5->cl_flags;
      bVar10 = uVar7 == uVar2;
      if (bVar10) {
        pCVar5->cl_flags = uVar7 | 0x20;
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
      UNLOCK();
    } while (!bVar10);
    if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s: %p %d @%s:%d","clnt_destroy_it",pCVar5,(ulong)(uint)pCVar5->cl_refcnt,
                 "local_rpcb",0x568);
    }
    if ((uVar7 & 0x20) == 0) {
      LOCK();
      piVar1 = &pCVar5->cl_refcnt;
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (((byte)__ntirpc_pkg_params.debug_flags & 0x10) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p %d @%s:%d","clnt_release_it",pCVar5,(ulong)(iVar3 - 1U),"local_rpcb",
                   0x568);
      }
      if ((int)(iVar3 - 1U) < 1) {
        local_rpcb_cold_1();
      }
    }
    pCVar5 = getclnthandle(local_rpcb::hostname,local_rpcb::loopnconf,(char **)0x0);
  }
  return pCVar5;
}

Assistant:

static CLIENT *local_rpcb(const char *tag)
{
	CLIENT *client = NULL;
	char *t;
	static struct netconfig *loopnconf = NULL;
	static char *hostname;
	extern mutex_t loopnconf_lock;
	struct netbuf nbuf;
	struct sockaddr_un sun;
	size_t tsize;
	int sock;

	/*
	 * Try connecting to the local rpcbind through a local socket
	 * first. If this doesn't work, try all transports defined in
	 * the netconfig file.
	 */
	memset(&sun, 0, sizeof(sun));
	sock = socket(AF_LOCAL, SOCK_STREAM, 0);
	if (sock < 0) {
		/* For error codes */
		client = clnt_raw_ncreate(RPCBPROG, RPCBVERS);
		goto try_nconf;
	}
	sun.sun_family = AF_LOCAL;
	strcpy(sun.sun_path, _PATH_RPCBINDSOCK);
	nbuf.len = SUN_LEN(&sun);
	nbuf.maxlen = sizeof(struct sockaddr_un);
	nbuf.buf = &sun;

	tsize = __rpc_get_t_size(AF_LOCAL, 0, 0);
	client = clnt_vc_ncreatef(sock, &nbuf, (rpcprog_t) RPCBPROG,
				  (rpcvers_t) RPCBVERS, tsize, tsize,
				  CLNT_CREATE_FLAG_CLOSE |
				  CLNT_CREATE_FLAG_CONNECT);

	if (CLNT_SUCCESS(client)) {
		return client;
	}
	t = rpc_sperror(&client->cl_error, tag);

	__warnx(TIRPC_DEBUG_FLAG_CLNT_RPCB, "%s", t);
	mem_free(t, RPC_SPERROR_BUFLEN);

	/* Save client for error return */

	/* Nobody needs this socket anymore; free the descriptor. */
	close(sock);

 try_nconf:
	/* VARIABLES PROTECTED BY loopnconf_lock: loopnconf */
	mutex_lock(&loopnconf_lock);
	if (loopnconf == NULL) {
		struct netconfig *nconf, *tmpnconf = NULL;
		void *nc_handle;
		int fd;

		nc_handle = setnetconfig();
		if (nc_handle == NULL) {
			/* fails to open netconfig file */
			syslog(LOG_ERR, "rpc: failed to open " NETCONFIG);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to open " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		while ((nconf = getnetconfig(nc_handle)) != NULL) {
#ifdef INET6
			if ((strcmp(nconf->nc_protofmly, NC_INET6) == 0 ||
#else
			if ((
#endif
				    strcmp(nconf->nc_protofmly, NC_INET) == 0)
			    && (nconf->nc_semantics == NC_TPI_COTS
				|| nconf->nc_semantics == NC_TPI_COTS_ORD)) {
				fd = __rpc_nconf2fd(nconf);
				/*
				 * Can't create a socket, assume that
				 * this family isn't configured in the kernel.
				 */
				if (fd < 0)
					continue;
				close(fd);
				tmpnconf = nconf;
				if (!strcmp(nconf->nc_protofmly, NC_INET))
					hostname = IN4_LOCALHOST_STRING;
				else
					hostname = IN6_LOCALHOST_STRING;
			}
		}
		if (tmpnconf == NULL) {
			endnetconfig(nc_handle);
			mutex_unlock(&loopnconf_lock);
			__warnx(TIRPC_DEBUG_FLAG_WARN,
				"%s(%s): failed to find " NETCONFIG " %s",
				__func__, tag, clnt_sperrno(RPC_UNKNOWNPROTO));
			client->cl_error.re_status = RPC_UNKNOWNPROTO;
			return (client);
		}
		loopnconf = getnetconfigent(tmpnconf->nc_netid);
		/* loopnconf is never freed */
		endnetconfig(nc_handle);
	}